

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

char * food_xname(obj *food,boolean the_pfx)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *bufp;
  char *pcStack_20;
  int mnum;
  char *result;
  boolean the_pfx_local;
  obj *food_local;
  
  iVar1 = food->corpsenm;
  if ((food->otyp == 0x10e) && ((mons[iVar1].geno & 0x1000) != 0)) {
    pcStack_20 = xname(food);
    bVar4 = false;
    if (the_pfx != '\0') {
      bVar4 = (mons[iVar1].mflags2 & 0x80000) == 0;
    }
    pcVar2 = "";
    if (bVar4) {
      pcVar2 = "the ";
    }
    pcVar3 = mons_mname(mons + iVar1);
    pcVar3 = s_suffix(pcVar3);
    sprintf(pcStack_20,"%s%s corpse",pcVar2,pcVar3);
  }
  else {
    pcStack_20 = singular(food,xname);
    if (the_pfx != '\0') {
      pcStack_20 = the(pcStack_20);
    }
  }
  return pcStack_20;
}

Assistant:

static const char *food_xname(struct obj *food, boolean the_pfx)
{
	const char *result;
	int mnum = food->corpsenm;

	if (food->otyp == CORPSE && (mons[mnum].geno & G_UNIQ)) {
	    /* grab xname()'s modifiable return buffer for our own use */
	    char *bufp = xname(food);
	    sprintf(bufp, "%s%s corpse",
		    (the_pfx && !type_is_pname(&mons[mnum])) ? "the " : "",
		    s_suffix(mons_mname(&mons[mnum])));
	    result = bufp;
	} else {
	    /* the ordinary case */
	    result = singular(food, xname);
	    if (the_pfx) result = the(result);
	}
	return result;
}